

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintToFloatingPoint<long_double>
               (floating_point<long_double> *f,iu_ostream *os)

{
  undefined1 value [16];
  ostream *poVar1;
  iu_stringstream ss;
  longdouble lVar2;
  undefined6 in_stack_fffffffffffffe22;
  string local_1d8;
  string local_1b8 [32];
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [46];
  
  std::__cxx11::stringstream::stringstream(local_198);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x14;
  lVar2 = *(longdouble *)&f->m_v;
  std::ostream::_M_insert<long_double>(lVar2);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(os,local_1b8);
  poVar1 = std::operator<<(poVar1,"(0x");
  value._10_6_ = in_stack_fffffffffffffe22;
  value._0_10_ = lVar2;
  ToHexString<unsigned__int128>(&local_1d8,*(detail **)&f->m_v,(unsigned___int128)value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}